

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

double __thiscall Json::Value::asDouble(Value *this)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  double *in_RDI;
  undefined1 auVar4 [16];
  ostringstream oss;
  double val;
  double *in_stack_fffffffffffffde0;
  ostringstream *this_00;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  string *in_stack_fffffffffffffdf0;
  double local_1f8;
  string local_1e0 [32];
  ostringstream local_1c0 [392];
  string local_38;
  double local_18;
  Value *in_stack_fffffffffffffff8;
  
  switch(*(byte *)(in_RDI + 1)) {
  case 0:
    local_1f8 = 0.0;
    break;
  case 1:
  case 3:
    local_1f8 = (double)(long)*in_RDI;
    break;
  case 2:
    dVar1 = *in_RDI;
    auVar4._8_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar4._0_8_ = dVar1;
    auVar4._12_4_ = 0x45300000;
    local_1f8 = (auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0);
    break;
  case 4:
    local_1f8 = *in_RDI;
    break;
  case 5:
    in_stack_fffffffffffffdf0 = &local_38;
    asString_abi_cxx11_(in_stack_fffffffffffffff8);
    std::__cxx11::string::c_str();
    bVar2 = convertToDouble((char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                            in_stack_fffffffffffffde0);
    bVar3 = bVar2 ^ 0xff;
    std::__cxx11::string::~string((string *)&local_38);
    local_1f8 = local_18;
    if ((bVar3 & 1) != 0) goto switchD_00185a25_default;
    break;
  case 6:
    local_1f8 = 1.0;
    if (((ulong)*in_RDI & 1) == 0) {
      local_1f8 = 0.0;
    }
    break;
  default:
switchD_00185a25_default:
    this_00 = local_1c0;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Value is not convertible to double.");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_1e0);
    abort();
  }
  return local_1f8;
}

Assistant:

double Value::asDouble() const {
  switch (type_) {
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    return static_cast<double>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<double>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return integerToDouble(value_.uint_);
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return value_.real_;
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0 : 0.0;
  case stringValue: {
    double val;

    if (!convertToDouble(asString().c_str(), &val)) {
      break;
    }

    return val;
  }
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to double.");
}